

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_aef201::HandleArchiveExtractCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  Status SVar5;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  string_view name_03;
  static_string_view name_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string destDir;
  string inFile;
  cmWorkingDirectory workdir;
  _Any_data local_100;
  _Manager_type local_f0;
  _Invoker_type p_Stack_e8;
  bool local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  Arguments parsedArgs;
  
  if ((anonymous_namespace)::
      HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::parser == '\0') {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
    if (iVar3 != 0) {
      parsedArgs.Destination._M_string_length = 0;
      parsedArgs.Destination.field_2._M_allocated_capacity = 0;
      parsedArgs.Verbose = false;
      parsedArgs.ListOnly = false;
      parsedArgs._82_6_ = 0;
      parsedArgs.Destination._M_dataplus._M_p = (pointer)0x0;
      parsedArgs.Input.field_2._M_allocated_capacity = 0;
      parsedArgs.Input.field_2._8_8_ = 0;
      parsedArgs.Input._M_dataplus._M_p = (pointer)0x0;
      parsedArgs.Input._M_string_length = 0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = (_Base_ptr)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count =
           0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = _S_red;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
           = 0;
      name.super_string_view._M_str = "INPUT";
      name.super_string_view._M_len = 5;
      cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name,0x30);
      name_00.super_string_view._M_str = "VERBOSE";
      name_00.super_string_view._M_len = 7;
      cmArgumentParser<Arguments>::Bind<bool>
                ((cmArgumentParser<Arguments> *)&parsedArgs,name_00,0x50);
      name_01.super_string_view._M_str = "LIST_ONLY";
      name_01.super_string_view._M_len = 9;
      cmArgumentParser<Arguments>::Bind<bool>
                ((cmArgumentParser<Arguments> *)&parsedArgs,name_01,0x51);
      name_02.super_string_view._M_str = "DESTINATION";
      name_02.super_string_view._M_len = 0xb;
      cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_02,0x58);
      workdir.OldDir._M_string_length = 0;
      workdir.OldDir._M_dataplus._M_p = (pointer)0x78;
      workdir.OldDir.field_2._8_8_ =
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
           ::_M_invoke;
      workdir.OldDir.field_2._M_allocated_capacity =
           (size_type)
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
           ::_M_manager;
      name_03._M_str = "PATTERNS";
      name_03._M_len = 8;
      ArgumentParser::Base::Bind((Base *)&parsedArgs,name_03,(KeywordAction *)&workdir);
      std::_Function_base::~_Function_base((_Function_base *)&workdir);
      name_04.super_string_view._M_str = "TOUCH";
      name_04.super_string_view._M_len = 5;
      cmArgumentParser<Arguments>::Bind<bool>
                ((cmArgumentParser<Arguments> *)&parsedArgs,name_04,0x90);
      ArgumentParser::ActionMap::ActionMap
                ((ActionMap *)&HandleArchiveExtractCommand::parser,(ActionMap *)&parsedArgs);
      ArgumentParser::ActionMap::~ActionMap((ActionMap *)&parsedArgs);
      __cxa_atexit(ArgumentParser::Base::~Base,&HandleArchiveExtractCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
  }
  workdir.OldDir.field_2._M_allocated_capacity = (size_type)&unrecognizedArguments;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inFile._M_string_length =
       (size_type)
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
       & 0xffffffff00000000;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  inFile._M_dataplus._M_p =
       (pointer)((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parsedArgs.Input._M_dataplus._M_p = (pointer)&parsedArgs.Input.field_2;
  parsedArgs.Input._M_string_length = 0;
  parsedArgs.Input.field_2._M_allocated_capacity =
       parsedArgs.Input.field_2._M_allocated_capacity & 0xffffffffffffff00;
  parsedArgs._80_8_ = parsedArgs._80_8_ & 0xffffffffffff0000;
  parsedArgs.Destination._M_dataplus._M_p = (pointer)&parsedArgs.Destination.field_2;
  parsedArgs.Destination._M_string_length = 0;
  parsedArgs.Destination.field_2._M_allocated_capacity =
       parsedArgs.Destination.field_2._M_allocated_capacity & 0xffffffffffffff00;
  parsedArgs.Patterns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsedArgs.Patterns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  parsedArgs.Patterns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  parsedArgs.Patterns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  parsedArgs._137_8_ = 0;
  workdir.OldDir._M_dataplus._M_p = (pointer)&HandleArchiveExtractCommand::parser;
  workdir.OldDir._M_string_length = (size_type)&parsedArgs;
  workdir.ResultCode = 0;
  workdir._36_4_ = 0;
  local_100._M_unused._M_object = (void *)0x0;
  local_100._8_8_ = 0;
  local_f0 = (_Manager_type)0x0;
  p_Stack_e8 = (_Invoker_type)0x0;
  local_e0 = false;
  workdir.OldDir.field_2._8_8_ = workdir.OldDir._M_string_length;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)&workdir,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&inFile,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_100);
  if (unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cmStrCat<char_const(&)[25],std::__cxx11::string&,char_const(&)[2]>
              (&workdir.OldDir,(char (*) [25])0x6e5832,
               unrecognizedArguments.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(char (*) [2])0x70274e);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&workdir);
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar1 = false;
    goto LAB_002e3dc8;
  }
  bVar1 = ArgumentParser::ParseResult::MaybeReportError
                    (&parsedArgs.super_ParseResult,status->Makefile);
  if (bVar1) {
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar1 = true;
    goto LAB_002e3dc8;
  }
  std::__cxx11::string::string((string *)&inFile,(string *)&parsedArgs.Input);
  if (parsedArgs.ListOnly == true) {
    bVar2 = cmSystemTools::ListTar
                      (&inFile,&parsedArgs.Patterns.
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ,parsedArgs.Verbose);
    bVar1 = true;
    if (!bVar2) {
      cmStrCat<char_const(&)[17],std::__cxx11::string&>
                (&workdir.OldDir,(char (*) [17])"failed to list: ",&inFile);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&workdir);
      cmSystemTools::s_FatalErrorOccurred = true;
      goto LAB_002e3dbc;
    }
  }
  else {
    psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(status->Makefile);
    std::__cxx11::string::string((string *)&destDir,(string *)psVar4);
    if (parsedArgs.Destination._M_string_length == 0) {
LAB_002e3cf1:
      cmWorkingDirectory::cmWorkingDirectory(&workdir,&destDir);
      if (workdir.ResultCode == 0) {
        bVar1 = cmSystemTools::ExtractTar
                          (&inFile,&parsedArgs.Patterns.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ,(uint)parsedArgs.Touch,parsedArgs.Verbose);
        if (bVar1) {
          cmWorkingDirectory::~cmWorkingDirectory(&workdir);
          std::__cxx11::string::~string((string *)&destDir);
          bVar1 = true;
          goto LAB_002e3dbe;
        }
        cmStrCat<char_const(&)[20],std::__cxx11::string&>
                  (&local_1a0,(char (*) [20])"failed to extract: ",&inFile);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        cmStrCat<char_const(&)[40],std::__cxx11::string&>
                  (&local_1a0,(char (*) [40])"failed to change working directory to: ",&destDir);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      std::__cxx11::string::~string((string *)&local_1a0);
      cmSystemTools::s_FatalErrorOccurred = true;
      cmWorkingDirectory::~cmWorkingDirectory(&workdir);
    }
    else {
      bVar1 = cmsys::SystemTools::FileIsFullPath(&parsedArgs.Destination);
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)&destDir);
      }
      else {
        cmStrCat<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  (&workdir.OldDir,&destDir,(char (*) [2])0x776e31,&parsedArgs.Destination);
        std::__cxx11::string::operator=((string *)&destDir,(string *)&workdir);
        std::__cxx11::string::~string((string *)&workdir);
      }
      SVar5 = cmsys::SystemTools::MakeDirectory(&destDir,(mode_t *)0x0);
      if (SVar5.Kind_ == Success) {
        bVar1 = cmsys::SystemTools::FileIsFullPath(&inFile);
        if (!bVar1) {
          cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
          cmStrCat<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                    (&workdir.OldDir,&local_1a0,(char (*) [2])0x776e31,&inFile);
          std::__cxx11::string::operator=((string *)&inFile,(string *)&workdir);
          std::__cxx11::string::~string((string *)&workdir);
          std::__cxx11::string::~string((string *)&local_1a0);
        }
        goto LAB_002e3cf1;
      }
      cmStrCat<char_const(&)[29],std::__cxx11::string&>
                (&workdir.OldDir,(char (*) [29])"failed to create directory: ",&destDir);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&workdir);
      cmSystemTools::s_FatalErrorOccurred = true;
    }
    std::__cxx11::string::~string((string *)&destDir);
LAB_002e3dbc:
    bVar1 = false;
  }
LAB_002e3dbe:
  std::__cxx11::string::~string((string *)&inFile);
LAB_002e3dc8:
  HandleArchiveExtractCommand::Arguments::~Arguments(&parsedArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unrecognizedArguments);
  return bVar1;
}

Assistant:

bool HandleArchiveExtractCommand(std::vector<std::string> const& args,
                                 cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    std::string Input;
    bool Verbose = false;
    bool ListOnly = false;
    std::string Destination;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Patterns;
    bool Touch = false;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("INPUT"_s, &Arguments::Input)
                               .Bind("VERBOSE"_s, &Arguments::Verbose)
                               .Bind("LIST_ONLY"_s, &Arguments::ListOnly)
                               .Bind("DESTINATION"_s, &Arguments::Destination)
                               .Bind("PATTERNS"_s, &Arguments::Patterns)
                               .Bind("TOUCH"_s, &Arguments::Touch);

  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &unrecognizedArguments);
  auto argIt = unrecognizedArguments.begin();
  if (argIt != unrecognizedArguments.end()) {
    status.SetError(cmStrCat("Unrecognized argument: \"", *argIt, "\""));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  std::string inFile = parsedArgs.Input;

  if (parsedArgs.ListOnly) {
    if (!cmSystemTools::ListTar(inFile, parsedArgs.Patterns,
                                parsedArgs.Verbose)) {
      status.SetError(cmStrCat("failed to list: ", inFile));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  } else {
    std::string destDir = status.GetMakefile().GetCurrentBinaryDirectory();
    if (!parsedArgs.Destination.empty()) {
      if (cmSystemTools::FileIsFullPath(parsedArgs.Destination)) {
        destDir = parsedArgs.Destination;
      } else {
        destDir = cmStrCat(destDir, "/", parsedArgs.Destination);
      }

      if (!cmSystemTools::MakeDirectory(destDir)) {
        status.SetError(cmStrCat("failed to create directory: ", destDir));
        cmSystemTools::SetFatalErrorOccurred();
        return false;
      }

      if (!cmSystemTools::FileIsFullPath(inFile)) {
        inFile =
          cmStrCat(cmSystemTools::GetCurrentWorkingDirectory(), "/", inFile);
      }
    }

    cmWorkingDirectory workdir(destDir);
    if (workdir.Failed()) {
      status.SetError(
        cmStrCat("failed to change working directory to: ", destDir));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }

    if (!cmSystemTools::ExtractTar(
          inFile, parsedArgs.Patterns,
          parsedArgs.Touch ? cmSystemTools::cmTarExtractTimestamps::No
                           : cmSystemTools::cmTarExtractTimestamps::Yes,
          parsedArgs.Verbose)) {
      status.SetError(cmStrCat("failed to extract: ", inFile));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  }

  return true;
}